

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cc
# Opt level: O2

unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
bssl::VerifyTrustStore::FromDER(string_view der_certs,string *out_diagnostic)

{
  bool bVar1;
  int iVar2;
  string *in_RCX;
  __uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
  this;
  string *in_R8;
  unsigned_long __val;
  Span<const_unsigned_char> cert_00;
  undefined8 local_c0;
  TrustStoreInMemory *local_b8;
  _Head_base<0UL,_bssl::TrustStoreInMemory_*,_false> local_b0;
  TrustStoreInMemory *local_a8;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_a0;
  CBS cert;
  optional<std::shared_ptr<const_bssl::ParsedCertificate>_> parsed_cert;
  string local_60;
  CBS cbs;
  
  this.super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>)
       der_certs._M_len;
  ::std::make_unique<bssl::TrustStoreInMemory>();
  local_c0 = *(undefined8 *)
              this.
              super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
              .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
  __val = 1;
  cbs.data = (uint8_t *)out_diagnostic;
  cbs.len = (size_t)der_certs._M_str;
  do {
    if (cbs.len == 0) {
      *(undefined8 *)
       this.
       super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
       _M_t.
       super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
       .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = local_c0;
      local_b0._M_head_impl = local_b8;
      local_b8 = (TrustStoreInMemory *)0x0;
      WrapTrustStore((bssl *)this.
                             super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
                             .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl,
                     (unique_ptr<bssl::TrustStoreInMemory,_std::default_delete<bssl::TrustStoreInMemory>_>
                      *)&local_b0);
      if (local_b0._M_head_impl != (TrustStoreInMemory *)0x0) {
        (*((local_b0._M_head_impl)->super_TrustStore).super_CertIssuerSource._vptr_CertIssuerSource
          [1])();
      }
      local_b0._M_head_impl = (TrustStoreInMemory *)0x0;
LAB_00388876:
      if (local_b8 != (TrustStoreInMemory *)0x0) {
        (*(local_b8->super_TrustStore).super_CertIssuerSource._vptr_CertIssuerSource[1])();
      }
      return (__uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
              )(tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
               this.
               super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
               .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
    }
    iVar2 = CBS_get_asn1_element(&cbs,&cert,0x20000010);
    if (iVar2 == 0) {
      *(undefined8 *)
       this.
       super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
       _M_t.
       super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
       .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = local_c0;
      ::std::__cxx11::to_string(&local_60,__val);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parsed_cert,"failed to get ASN.1 SEQUENCE from input at cert ",&local_60);
      ::std::__cxx11::string::operator=(in_RCX,(string *)&parsed_cert);
      ::std::__cxx11::string::~string((string *)&parsed_cert);
      ::std::__cxx11::string::~string((string *)&local_60);
      *(undefined8 *)
       this.
       super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
       _M_t.
       super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
       .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = 0;
      goto LAB_00388876;
    }
    cert_00.size_ = (size_t)in_RCX;
    cert_00.data_ = (uchar *)cert.len;
    anon_unknown_18::InternalParseCertificate
              (&parsed_cert,(anon_unknown_18 *)cert.data,cert_00,in_R8);
    bVar1 = parsed_cert.
            super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>
            .super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>.
            _M_engaged;
    if (parsed_cert.
        super__Optional_base<std::shared_ptr<const_bssl::ParsedCertificate>,_false,_false>.
        _M_payload.
        super__Optional_payload<std::shared_ptr<const_bssl::ParsedCertificate>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>._M_engaged ==
        false) {
      local_c0 = 0;
    }
    else {
      local_a8 = local_b8;
      ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,
                 (__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                 &parsed_cert);
      TrustStoreInMemory::AddTrustAnchor
                (local_a8,(shared_ptr<const_bssl::ParsedCertificate> *)&local_a0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    }
    ::std::_Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<const_bssl::ParsedCertificate>_> *)
               &parsed_cert);
    if (bVar1 == false) {
      *(undefined8 *)
       this.
       super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>.
       _M_t.
       super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
       .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = local_c0;
      goto LAB_00388876;
    }
    __val = __val + 1;
  } while( true );
}

Assistant:

std::unique_ptr<VerifyTrustStore> VerifyTrustStore::FromDER(
    std::string_view der_certs, std::string *out_diagnostic) {
  auto store = std::make_unique<TrustStoreInMemory>();
  CBS cbs = StringAsBytes(der_certs);

  for (size_t cert_num = 1; CBS_len(&cbs) != 0; cert_num++) {
    CBS cert;
    if (!CBS_get_asn1_element(&cbs, &cert, CBS_ASN1_SEQUENCE)) {
      *out_diagnostic = "failed to get ASN.1 SEQUENCE from input at cert " +
                        std::to_string(cert_num);
      return {};
    }

    auto parsed_cert = InternalParseCertificate(cert, out_diagnostic);
    if (!parsed_cert.has_value()) {
      return {};
    }
    store->AddTrustAnchor(parsed_cert.value());
  }

  return WrapTrustStore(std::move(store));
}